

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SceneCombiner.cpp
# Opt level: O0

void Assimp::SceneCombiner::MergeScenes
               (aiScene **_dest,vector<aiScene_*,_std::allocator<aiScene_*>_> *src,uint flags)

{
  bool bVar1;
  aiScene *paVar2;
  aiNode *this;
  size_type sVar3;
  ulong uVar4;
  reference ppaVar5;
  reference pvVar6;
  AttachmentInfo local_68;
  uint local_58;
  allocator<Assimp::AttachmentInfo> local_51;
  uint i;
  vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> srcList;
  aiScene *master;
  uint flags_local;
  vector<aiScene_*,_std::allocator<aiScene_*>_> *src_local;
  aiScene **_dest_local;
  
  if (_dest != (aiScene **)0x0) {
    bVar1 = std::vector<aiScene_*,_std::allocator<aiScene_*>_>::empty(src);
    if (bVar1) {
      if (*_dest == (aiScene *)0x0) {
        ppaVar5 = std::vector<aiScene_*,_std::allocator<aiScene_*>_>::operator[](src,0);
        *_dest = *ppaVar5;
      }
      else {
        aiScene::~aiScene(*_dest);
        ppaVar5 = std::vector<aiScene_*,_std::allocator<aiScene_*>_>::operator[](src,0);
        CopySceneFlat(_dest,*ppaVar5);
      }
    }
    else {
      if (*_dest == (aiScene *)0x0) {
        paVar2 = (aiScene *)operator_new(0x80);
        aiScene::aiScene(paVar2);
        *_dest = paVar2;
      }
      else {
        aiScene::~aiScene(*_dest);
      }
      paVar2 = (aiScene *)operator_new(0x80);
      aiScene::aiScene(paVar2);
      srcList.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)paVar2;
      this = (aiNode *)operator_new(0x478);
      aiNode::aiNode(this);
      (srcList.super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage)->attachToNode = this;
      aiString::Set(&(srcList.
                      super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage)->attachToNode->mName,
                    "<MergeRoot>");
      sVar3 = std::vector<aiScene_*,_std::allocator<aiScene_*>_>::size(src);
      std::allocator<Assimp::AttachmentInfo>::allocator(&local_51);
      std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::vector
                ((vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *)&i,sVar3
                 ,&local_51);
      std::allocator<Assimp::AttachmentInfo>::~allocator(&local_51);
      for (local_58 = 0; uVar4 = (ulong)local_58,
          sVar3 = std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::size
                            ((vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                              *)&i), uVar4 < sVar3; local_58 = local_58 + 1) {
        ppaVar5 = std::vector<aiScene_*,_std::allocator<aiScene_*>_>::operator[]
                            (src,(ulong)local_58);
        AttachmentInfo::AttachmentInfo
                  (&local_68,*ppaVar5,
                   (srcList.
                    super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->attachToNode);
        pvVar6 = std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::
                 operator[]((vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                             *)&i,(ulong)local_58);
        pvVar6->scene = local_68.scene;
        pvVar6->attachToNode = local_68.attachToNode;
      }
      MergeScenes(_dest,(aiScene *)
                        srcList.
                        super__Vector_base<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                  (vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *)&i,
                  flags);
      std::vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_>::~vector
                ((vector<Assimp::AttachmentInfo,_std::allocator<Assimp::AttachmentInfo>_> *)&i);
    }
  }
  return;
}

Assistant:

void SceneCombiner::MergeScenes(aiScene** _dest,std::vector<aiScene*>& src, unsigned int flags) {
    if ( nullptr == _dest ) {
        return;
    }

    // if _dest points to NULL allocate a new scene. Otherwise clear the old and reuse it
    if (src.empty()) {
        if (*_dest) {
            (*_dest)->~aiScene();
            SceneCombiner::CopySceneFlat(_dest,src[0]);
        }
        else *_dest = src[0];
        return;
    }
    if (*_dest)(*_dest)->~aiScene();
    else *_dest = new aiScene();

    // Create a dummy scene to serve as master for the others
    aiScene* master = new aiScene();
    master->mRootNode = new aiNode();
    master->mRootNode->mName.Set("<MergeRoot>");

    std::vector<AttachmentInfo> srcList (src.size());
    for (unsigned int i = 0; i < srcList.size();++i)    {
        srcList[i] = AttachmentInfo(src[i],master->mRootNode);
    }

    // 'master' will be deleted afterwards
    MergeScenes (_dest, master, srcList, flags);
}